

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O2

void __thiscall
TilesBoard::createTiles(TilesBoard *this,size_t boardSize,size_t tileSize,QMainWindow *window)

{
  long *plVar1;
  _Head_base<0UL,_QPushButton_*,_false> _Var2;
  TilesBoard *pTVar3;
  vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *pvVar4;
  QHBoxLayout *this_00;
  size_t sVar5;
  size_t sVar6;
  _Head_base<0UL,_QPushButton_*,_false> local_d8;
  TilesBoard *local_d0;
  vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *local_c8;
  size_t local_c0;
  size_t local_b8;
  QMainWindow *local_b0;
  function<void_()> *local_a8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  Object local_70 [8];
  QArrayDataPointer<char16_t> local_68;
  function<void_()> local_50;
  
  local_c0 = boardSize;
  local_b0 = window;
  deleteTiles(this);
  QBoxLayout::addStretch((int)this->verticalLayout);
  local_c8 = (vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *)&this->horizontalLayouts;
  local_a8 = &this->pressTileSlot;
  local_d0 = this;
  for (sVar6 = 0; sVar6 != local_c0; sVar6 = sVar6 + 1) {
    this_00 = (QHBoxLayout *)operator_new(0x20);
    QHBoxLayout::QHBoxLayout(this_00);
    pvVar4 = local_c8;
    local_88.d = (Data *)this_00;
    std::vector<QHBoxLayout*,std::allocator<QHBoxLayout*>>::emplace_back<QHBoxLayout*>
              (local_c8,(QHBoxLayout **)&local_88);
    plVar1 = *(long **)(*(long *)pvVar4 + sVar6 * 8);
    (**(code **)(*plVar1 + 0x68))(plVar1,0);
    QBoxLayout::addStretch((int)*(undefined8 *)(*(long *)pvVar4 + sVar6 * 8));
    sVar5 = 0;
    while (pTVar3 = local_d0, local_c0 != sVar5) {
      local_b8 = sVar5;
      std::make_unique<QPushButton>();
      _Var2._M_head_impl = local_d8._M_head_impl;
      QString::number((ulong)&local_a0,(int)sVar6);
      QString::number((ulong)&local_68,(int)local_b8);
      operator+((QString *)&local_88,(QString *)&local_a0,(QString *)&local_68);
      QWidget::setAccessibleName((QString *)_Var2._M_head_impl);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QWidget::setMaximumSize((int)local_d8._M_head_impl,(int)tileSize);
      QWidget::setMinimumSize((int)local_d8._M_head_impl,(int)tileSize);
      _Var2._M_head_impl = local_d8._M_head_impl;
      std::function<void_()>::function(&local_50,local_a8);
      QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
                (local_70,(offset_in_QAbstractButton_to_subr)_Var2._M_head_impl,
                 (QObject *)QAbstractButton::clicked,(function<void_()> *)0x0,
                 (ConnectionType)local_b0);
      QMetaObject::Connection::~Connection((Connection *)local_70);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      QBoxLayout::addWidget(*(undefined8 *)(*(long *)local_c8 + sVar6 * 8),local_d8._M_head_impl,0);
      std::
      vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
      ::emplace_back<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>
                ((vector<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>,std::allocator<std::unique_ptr<QPushButton,std::default_delete<QPushButton>>>>
                  *)local_d0,(unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *)&local_d8
                );
      if (local_d8._M_head_impl != (QPushButton *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 0x20))();
      }
      sVar5 = local_b8 + 1;
    }
    QBoxLayout::addStretch
              ((int)(local_d0->horizontalLayouts).
                    super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar6]);
    QBoxLayout::addLayout
              ((QLayout *)pTVar3->verticalLayout,
               (int)(pTVar3->horizontalLayouts).
                    super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar6]);
  }
  QBoxLayout::addStretch((int)local_d0->verticalLayout);
  return;
}

Assistant:

void TilesBoard::createTiles( size_t boardSize, size_t tileSize, QMainWindow* window )
{
    deleteTiles();
    verticalLayout->addStretch();

    for ( size_t row = 0; row < boardSize; row++ )
    {
        horizontalLayouts.emplace_back( new QHBoxLayout() );
        horizontalLayouts[row]->setSpacing(0);
        horizontalLayouts[row]->addStretch();

        for ( size_t col = 0; col < boardSize; col++ )
        {
            auto tile = std::make_unique<QPushButton>();
            tile->setAccessibleName( QString::number( row ) + QString::number( col ));
            tile->setMaximumSize( tileSize, tileSize );
            tile->setMinimumSize( tileSize, tileSize );
            QObject::connect( tile.get(), &QPushButton::clicked, window, pressTileSlot );
            horizontalLayouts[row]->addWidget( tile.get() );
            tiles.push_back( std::move( tile ));
        }

        horizontalLayouts[row]->addStretch();
        verticalLayout->addLayout( horizontalLayouts[row] );
    }
    verticalLayout->addStretch();
}